

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker_base.hpp
# Opt level: O0

void __thiscall oqpi::worker_config::worker_config(worker_config *this)

{
  allocator<char> local_31;
  string local_30;
  worker_config *local_10;
  worker_config *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"oqpi::worker",&local_31);
  thread_attributes::thread_attributes(&this->threadAttributes,&local_30,0,all_cores,normal);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  this->workerPrio = wprio_any;
  this->count = 1;
  return;
}

Assistant:

worker_config()
            : threadAttributes("oqpi::worker")
            , workerPrio(worker_priority::wprio_any)
            , count(1)
        {}